

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FrameSpecsOf.hpp
# Opt level: O2

string * __thiscall
sciplot::FrameSpecsOf<sciplot::LegendSpecs>::repr_abi_cxx11_
          (string *__return_storage_ptr__,FrameSpecsOf<sciplot::LegendSpecs> *this)

{
  ostream *poVar1;
  stringstream ss;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  if (this->m_show == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"nobox",(allocator<char> *)local_1a0);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar1 = std::operator<<(local_190,"box ");
    LineSpecsOf<sciplot::LineSpecs>::repr_abi_cxx11_
              (&local_1c0,&(this->m_line_specs).super_LineSpecsOf<sciplot::LineSpecs>);
    std::operator<<(poVar1,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::stringbuf::str();
    internal::removeExtraWhitespaces(__return_storage_ptr__,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  return __return_storage_ptr__;
}

Assistant:

auto FrameSpecsOf<DerivedSpecs>::repr() const -> std::string
{
    if(m_show == false)
        return "nobox";

    std::stringstream ss;
    ss << "box " << m_line_specs.repr();
    return internal::removeExtraWhitespaces(ss.str());
}